

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmfrontalanal.cpp
# Opt level: O1

void __thiscall TPZSubMeshFrontalAnalysis::Run(TPZSubMeshFrontalAnalysis *this,ostream *out)

{
  char cVar1;
  TPZMatrixSolver<double> *pTVar2;
  TPZFMatrix<double> *pTVar3;
  TPZAutoPointer<TPZMatrix<double>_> solverMat;
  TPZAutoPointer<TPZMatrix<double>_> local_10;
  
  TPZSolutionMatrix::operator=
            (&this->fReferenceSolution,&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution)
  ;
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[9])(this);
  pTVar2 = TPZLinearAnalysis::MatrixSolver<double>(&this->super_TPZLinearAnalysis);
  local_10.fRef = (pTVar2->fContainer).fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  cVar1 = ((local_10.fRef)->fPointer->super_TPZBaseMatrix).fDecomposed;
  if (cVar1 != '\x04') {
    if (cVar1 == '\x03') {
      pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                         (&(this->super_TPZLinearAnalysis).fRhs);
      (*((local_10.fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])
                ((local_10.fRef)->fPointer,pTVar3);
    }
    else if (cVar1 == '\x01') {
      pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                         (&(this->super_TPZLinearAnalysis).fRhs);
      (*((local_10.fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])
                ((local_10.fRef)->fPointer,pTVar3);
    }
    TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_10);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"virtual void TPZSubMeshFrontalAnalysis::Run(std::ostream &)",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,": dont know what to do...\n",0x1a);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/pzsmfrontalanal.cpp"
             ,0x2e);
}

Assistant:

void TPZSubMeshFrontalAnalysis::Run(std::ostream &out){
	
	//fReducableStiff.Print("Reducable stiff before assembled");
    //TODOCOMPLEX
	fReferenceSolution = fSolution;
	Assemble();
    auto solverMat = MatrixSolver<STATE>().Matrix();
	//    fSolver->Solve(fRhs, fRhs);
    if(solverMat->IsDecomposed() == ELU)
    {
        TPZFMatrix<STATE> &rhs = fRhs;
        solverMat->Subst_Forward(&rhs);
    } else if(solverMat->IsDecomposed() == ECholesky)
    {
        TPZFMatrix<STATE> &rhs = fRhs;
        solverMat->Subst_Forward(&rhs);
    } else if(solverMat->IsDecomposed() == ELDLt)
    {
        PZError << __PRETTY_FUNCTION__;
        PZError << ": dont know what to do...\n";
        DebugStop();
    }    
}